

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O2

void __thiscall Assimp::OptimizeMeshesProcess::~OptimizeMeshesProcess(OptimizeMeshesProcess *this)

{
  (this->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__OptimizeMeshesProcess_00245580;
  std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
            (&(this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
            (&(this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  std::
  _Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
  ::~_Vector_base(&(this->meshes).
                   super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
                 );
  BaseProcess::~BaseProcess(&this->super_BaseProcess);
  return;
}

Assistant:

OptimizeMeshesProcess::~OptimizeMeshesProcess() {
    // empty
}